

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

int __thiscall ON_BinaryArchive::ArchiveCurrentDimStyleIndex(ON_BinaryArchive *this)

{
  bool bVar1;
  int iVar2;
  ON_UUID *pOVar3;
  ON_ComponentManifestItem *this_00;
  ON_DimStyle *pOVar4;
  
  pOVar4 = this->m_archive_current_dim_style;
  if (pOVar4 == (ON_DimStyle *)0x0) {
    pOVar4 = &ON_DimStyle::Default;
  }
  bVar1 = ON_ModelComponent::IsSystemComponent(&pOVar4->super_ON_ModelComponent);
  if (bVar1) {
    iVar2 = ON_ModelComponent::Index(&pOVar4->super_ON_ModelComponent);
    return iVar2;
  }
  pOVar4 = this->m_archive_current_dim_style;
  if (pOVar4 == (ON_DimStyle *)0x0) {
    pOVar4 = &ON_DimStyle::Default;
  }
  pOVar3 = ON_ModelComponent::Id(&pOVar4->super_ON_ModelComponent);
  this_00 = ON_ComponentManifest::ItemFromId(&this->m_manifest,DimStyle,*pOVar3);
  bVar1 = ON_ComponentManifestItem::IsValid(this_00);
  if (bVar1) {
    iVar2 = ON_ComponentManifestItem::Index(this_00);
    return iVar2;
  }
  return -1;
}

Assistant:

const int ON_BinaryArchive::ArchiveCurrentDimStyleIndex() const
{
  const ON_DimStyle& dim_style = ArchiveCurrentDimStyle();
  if (dim_style.IsSystemComponent())
    return dim_style.Index();

  const ON_ComponentManifestItem& item = m_manifest.ItemFromId(ON_ModelComponent::Type::DimStyle,ArchiveCurrentDimStyle().Id());
  if (item.IsValid())
    return item.Index();

  return -1;
}